

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O1

bool __thiscall wasm::LazyLocalGraph::isSSA(LazyLocalGraph *this,Index index)

{
  ulong uVar1;
  undefined1 uVar2;
  _Hash_node_base *p_Var3;
  size_type sVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  Index local_1c [2];
  Index index_local;
  
  uVar1 = (this->SSAIndexes)._M_h._M_bucket_count;
  uVar5 = (ulong)index % uVar1;
  p_Var6 = (this->SSAIndexes)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6, *(Index *)&p_Var6->_M_nxt[1]._M_nxt != index)) {
    while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, *(uint *)&p_Var3[1]._M_nxt == index)) goto LAB_009b84c7;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_009b84c7:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var7->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    local_1c[0] = index;
    uVar2 = computeSSA(this,index);
    sVar4 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&(this->SSAIndexes)._M_h,local_1c);
    if (sVar4 == 0) {
      __assert_fail("SSAIndexes.count(index)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/local-graph.h"
                    ,0xdd,"bool wasm::LazyLocalGraph::isSSA(Index) const");
    }
  }
  else {
    uVar2 = *(undefined1 *)((long)&p_Var3[1]._M_nxt + 4);
  }
  return (bool)uVar2;
}

Assistant:

bool isSSA(Index index) const {
    auto iter = SSAIndexes.find(index);
    if (iter == SSAIndexes.end()) {
      auto ret = computeSSA(index);
      // The result must have been memoized.
      assert(SSAIndexes.count(index));
      return ret;
    }
    return iter->second;
  }